

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_reconnect.cc
# Opt level: O3

int runReconnect(string *command,int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined8 uVar4;
  ostream *poVar5;
  long lVar6;
  int unaff_EBP;
  pointer pDVar7;
  char *pcVar8;
  int iVar9;
  string p;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> devices;
  undefined1 local_f0 [17];
  undefined7 uStack_df;
  uint local_cc;
  string *local_c8;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> local_c0;
  DeviceFilter local_a8;
  
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar9 = 0;
  local_cc = 0;
  local_c8 = command;
  do {
    if (argc <= iVar9) {
      if (((local_a8.mac.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_a8.mac.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) &&
          (local_a8.name.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_a8.name.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) &&
         (local_a8.serial.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_a8.serial.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"No filter set",0xd);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        unaff_EBP = 1;
        printHelp((ostream *)&std::cerr,local_c8);
      }
      else {
        discoverWithFilter(&local_c0,&local_a8);
        if ((pointer)CONCAT71(local_c0.
                              super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_c0.
                              super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_1_) ==
            local_c0.
            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          lVar6 = 0xf;
          pcVar8 = "No device found";
          goto LAB_001112cf;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Reconnecting the following devices:\n",0x24);
        printDeviceTable((ostream *)&std::cout,&local_c0,true,false,false);
        if ((local_cc & 1) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Are you sure? [y/N] ",0x14);
          local_f0._0_8_ = local_f0 + 0x10;
          local_f0._8_8_ = (pointer)0x0;
          local_f0[0x10] = 0;
          cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x78);
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,(string *)local_f0,cVar2);
          iVar9 = std::__cxx11::string::compare(local_f0);
          bVar1 = true;
          if ((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare(local_f0), iVar9 != 0)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cancel",6);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
            std::ostream::put('`');
            bVar1 = false;
            std::ostream::flush();
            unaff_EBP = 0;
          }
          if ((pointer)local_f0._0_8_ != (pointer)(local_f0 + 0x10)) {
            operator_delete((void *)local_f0._0_8_,CONCAT71(uStack_df,local_f0[0x10]) + 1);
          }
          if (!bVar1) goto LAB_00111311;
        }
        pDVar7 = (pointer)CONCAT71(local_c0.
                                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_c0.
                                   super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_);
        lVar6 = 4;
        pcVar8 = "Done";
        if (pDVar7 != local_c0.
                      super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            rcdiscover::ForceIP::ForceIP((ForceIP *)local_f0);
            rcdiscover::ForceIP::sendCommand((ForceIP *)local_f0,pDVar7->mac,0,0,0);
            std::vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_>::~vector
                      ((vector<rcdiscover::SocketLinux,_std::allocator<rcdiscover::SocketLinux>_> *)
                       local_f0);
            pDVar7 = pDVar7 + 1;
          } while (pDVar7 != local_c0.
                             super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
LAB_001112cf:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar6);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        unaff_EBP = 0;
        std::ostream::flush();
LAB_00111311:
        std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
                  (&local_c0);
      }
      break;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,argv[iVar9],(allocator<char> *)&local_c0);
    iVar9 = iVar9 + 1;
    uVar4 = std::__cxx11::string::compare((char *)local_f0);
    bVar1 = true;
    if ((int)uVar4 == 0) {
      local_cc = (uint)CONCAT71((int7)((ulong)uVar4 >> 8),1);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)local_f0);
      if (iVar3 == 0) {
        iVar3 = parseFilterArguments(argc - iVar9,argv + iVar9,&local_a8);
        iVar9 = iVar9 + iVar3;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_f0);
        if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_f0), iVar3 == 0)) {
          bVar1 = false;
          printHelp((ostream *)&std::cout,local_c8);
          unaff_EBP = 0;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Invalid argument: ",0x12);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_f0._0_8_,local_f0._8_8_);
          local_c0.
          super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
          _M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator<char>)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_c0,1);
          printHelp((ostream *)&std::cerr,local_c8);
          unaff_EBP = 1;
          bVar1 = false;
        }
      }
    }
    if ((pointer)local_f0._0_8_ != (pointer)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_,CONCAT71(uStack_df,local_f0[0x10]) + 1);
    }
  } while (bVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.model);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.iface);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.mac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.serial);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.name);
  return unaff_EBP;
}

Assistant:

int runReconnect(const std::string &command, int argc, char **argv)
{
  DeviceFilter device_filter{};
  bool yes = false;

  int i=0;
  while (i < argc)
  {
    std::string p=argv[i++];

    if (p == "-y")
    {
      yes = true;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        printHelp(std::cerr, command);
        return 1;
      }
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
  }

  if (device_filter.mac.empty() &&
      device_filter.name.empty() &&
      device_filter.serial.empty())
  {
    std::cerr << "No filter set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }

  const auto devices = discoverWithFilter(device_filter);

  if (devices.empty())
  {
    std::cout << "No device found" << std::endl;
    return 0;
  }

  std::cout << "Reconnecting the following devices:\n";
  printDeviceTable(std::cout, devices, true, false, false);

  if (!yes)
  {
    std::cout << "Are you sure? [y/N] ";
    std::string answer;
    std::getline(std::cin, answer);
    if (answer != "y" && answer != "Y")
    {
      std::cout << "Cancel" << std::endl;
      return 0;
    }
  }

  for (const auto &device : devices)
  {
    rcdiscover::ForceIP force_ip;
    force_ip.sendCommand(device.getMAC(), 0, 0, 0);
  }

  std::cout << "Done" << std::endl;

  return 0;
}